

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O1

bool __thiscall
Kernel::InterpretedLiteralEvaluator::balanceDivide
          (InterpretedLiteralEvaluator *this,Interpretation multiply,Term *AoverB,TermList A,
          TermList C,TermList *result,bool *swap)

{
  Signature *this_00;
  bool bVar1;
  uint fn;
  int iVar2;
  OperatorType *type;
  TermList TVar3;
  Term *pTVar4;
  TermList siglen;
  uchar *sig;
  TermList tbs;
  TermList *tbslen;
  RationalConstantType local_50;
  
  this_00 = DAT_00b7e1b0;
  siglen._content = A._content;
  tbs._content = C._content;
  tbslen = result;
  type = Theory::getNonpolymorphicOperatorType(multiply);
  fn = Signature::getInterpretingSymbol(this_00,multiply,type);
  bVar1 = false;
  TVar3 = Term::termArg(AoverB,0);
  if (TVar3._content == A._content) {
    TVar3 = Term::termArg(AoverB,1);
    pTVar4 = Term::create2(fn,C,TVar3);
    result->_content = (uint64_t)pTVar4;
    RationalConstantType::RationalConstantType(&local_50);
    bVar1 = Theory::tryInterpretConstant((Theory *)theory,TVar3,&local_50);
    if (bVar1) {
      iVar2 = RationalConstantType::sign
                        (&local_50,(EVP_PKEY_CTX *)TVar3._content,sig,(size_t *)siglen._content,
                         (uchar *)tbs._content,(size_t)tbslen);
      if ((char)iVar2 == '\x02') {
        *swap = (bool)(*swap ^ 1);
      }
    }
    mpz_clear(local_50._den._val);
    mpz_clear((__mpz_struct *)&local_50);
  }
  return bVar1;
}

Assistant:

bool InterpretedLiteralEvaluator::balanceDivide(Interpretation multiply, 
                       Term* AoverB, TermList A, TermList C, TermList& result, bool& swap)
{
#if VDEBUG
    TermList srt = theory->getOperationSort(multiply); 
    ASS(srt == AtomicSort::realSort() || srt == AtomicSort::rationalSort());
#endif

    unsigned mul = env.signature->getInterpretingSymbol(multiply);
    if(AoverB->termArg(0)!=A)return false;

    auto B = AoverB->termArg(1);

    result = TermList(Term::create2(mul,C,B));

    RationalConstantType bcon;
    if(theory->tryInterpretConstant(B,bcon)){
      ASS(!bcon.isZero());
      if(bcon.isNegative()){ swap=!swap; } // switch the polarity of an inequality if we're under one
      return true;
    }
    // Unsure exactly what the best thing to do here, so for now give up
    // This means we only balance when we have a constant on the variable side
    return false;    
}